

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

void __thiscall
pbrt::AsyncJob<pbrt::Light>::RunStep(AsyncJob<pbrt::Light> *this,unique_lock<std::mutex> *lock)

{
  ParallelJob *in_RDI;
  unique_lock<std::mutex> ul;
  Light r;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  unique_lock<std::mutex> *this_00;
  function<pbrt::Light_()> *in_stack_ffffffffffffffc8;
  unique_lock<std::mutex> local_18;
  
  ThreadPool::RemoveFromJobList(ParallelJob::threadPool,in_RDI);
  in_RDI[1].removed = true;
  std::unique_lock<std::mutex>::unlock(in_stack_ffffffffffffffc0);
  this_00 = &local_18;
  std::function<pbrt::Light_()>::operator()(in_stack_ffffffffffffffc8);
  std::unique_lock<std::mutex>::unique_lock(this_00,(mutex_type *)in_RDI);
  pstd::optional<pbrt::Light>::operator=((optional<pbrt::Light> *)this_00,(Light *)in_RDI);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return;
}

Assistant:

void RunStep(std::unique_lock<std::mutex> *lock) {
        threadPool->RemoveFromJobList(this);
        started = true;
        lock->unlock();
        // Execute asynchronous work and notify waiting threads of its completion
        T r = func();
        std::unique_lock<std::mutex> ul(mutex);
        result = r;
        cv.notify_all();
    }